

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdFetchMoffset(INSTRUX *Instrux,ND_UINT8 *Code,ND_UINT8 Offset,ND_SIZET Size,
                       ND_UINT8 MoffsetSize)

{
  ND_UINT64 NVar1;
  ND_UINT8 MoffsetSize_local;
  ND_SIZET Size_local;
  ND_UINT8 Offset_local;
  ND_UINT8 *Code_local;
  INSTRUX *Instrux_local;
  
  if (Size < (ulong)Offset + (ulong)MoffsetSize) {
    Instrux_local._4_4_ = 0x80000001;
  }
  else {
    *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 & 0xfffeffff | 0x10000;
    *(ulong *)&Instrux->field_0xc =
         *(ulong *)&Instrux->field_0xc & 0xfffffffff0ffffff | ((ulong)MoffsetSize & 0xf) << 0x18;
    *(ulong *)&Instrux->field_0xc =
         *(ulong *)&Instrux->field_0xc & 0xf0ffffffffffffff | ((ulong)Offset & 0xf) << 0x38;
    NVar1 = NdFetchData(Code + (int)(uint)Offset,MoffsetSize);
    (Instrux->field_74).Moffset = NVar1;
    Instrux->Length = Instrux->Length + MoffsetSize;
    if (Instrux->Length < 0x10) {
      Instrux_local._4_4_ = 0;
    }
    else {
      Instrux_local._4_4_ = 0x80000003;
    }
  }
  return Instrux_local._4_4_;
}

Assistant:

static NDSTATUS
NdFetchMoffset(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_UINT8 Offset,
    ND_SIZET Size,
    ND_UINT8 MoffsetSize
    )
{
    RET_GT((ND_SIZET)Offset + MoffsetSize, Size, ND_STATUS_BUFFER_TOO_SMALL);

    Instrux->HasMoffset = ND_TRUE;
    Instrux->MoffsetLength = MoffsetSize;
    Instrux->MoffsetOffset = Offset;

    Instrux->Moffset = NdFetchData(Code + Offset, MoffsetSize);

    Instrux->Length += MoffsetSize;
    if (Instrux->Length > ND_MAX_INSTRUCTION_LENGTH)
    {
        return ND_STATUS_INSTRUCTION_TOO_LONG;
    }

    return ND_STATUS_SUCCESS;
}